

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O1

bool duckdb::ParquetMultiFileInfo::TryInitializeScan
               (ClientContext *context,shared_ptr<duckdb::BaseFileReader,_true> *reader_p,
               GlobalTableFunctionState *gstate_p,LocalTableFunctionState *lstate_p)

{
  _func_int **pp_Var1;
  ParquetReader *this;
  _func_int **pp_Var2;
  initializer_list<unsigned_long> __l;
  vector<unsigned_long,_true> group_indexes;
  allocator_type local_69;
  vector<unsigned_long,_true> local_68;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  _func_int **local_38;
  
  this = (ParquetReader *)shared_ptr<duckdb::BaseFileReader,_true>::operator->(reader_p);
  pp_Var1 = gstate_p[1]._vptr_GlobalTableFunctionState;
  pp_Var2 = (_func_int **)ParquetReader::NumRowGroups(this);
  if (pp_Var1 < pp_Var2) {
    local_38 = gstate_p[1]._vptr_GlobalTableFunctionState;
    __l._M_len = 1;
    __l._M_array = (iterator)&local_38;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_50,__l,&local_69);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_68,&local_50);
    ParquetReader::InitializeScan(this,context,(ParquetReaderScanState *)(lstate_p + 1),&local_68);
    if (local_68.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    gstate_p[1]._vptr_GlobalTableFunctionState =
         (_func_int **)((long)gstate_p[1]._vptr_GlobalTableFunctionState + 1);
    if (local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return pp_Var1 < pp_Var2;
}

Assistant:

bool ParquetMultiFileInfo::TryInitializeScan(ClientContext &context, shared_ptr<BaseFileReader> &reader_p,
                                             GlobalTableFunctionState &gstate_p, LocalTableFunctionState &lstate_p) {
	auto &gstate = gstate_p.Cast<ParquetReadGlobalState>();
	auto &lstate = lstate_p.Cast<ParquetReadLocalState>();
	auto &reader = reader_p->Cast<ParquetReader>();
	if (gstate.row_group_index >= reader.NumRowGroups()) {
		// scanned all row groups in this file
		return false;
	}
	// The current reader has rowgroups left to be scanned
	vector<idx_t> group_indexes {gstate.row_group_index};
	reader.InitializeScan(context, lstate.scan_state, group_indexes);
	gstate.row_group_index++;
	return true;
}